

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_mime_message_skeleton.c
# Opt level: O0

void usage(void)

{
  printf("\n");
  printf("libcmime - simple api demonstration\n");
  printf("-----------------------------------\n");
  printf(
        "demonstrates: creation of new CMimeMessage_T object with cmime_message_create_skeleton function.\n"
        );
  printf(
        "output: output is written to stdout if no output file is specified (-f /path/to/out_file.txt)\n"
        );
  printf("\n");
  return;
}

Assistant:

void usage() {
    printf("\n");
    printf("libcmime - simple api demonstration\n");
    printf("-----------------------------------\n");
    printf("demonstrates: creation of new CMimeMessage_T object with cmime_message_create_skeleton function.\n");
    printf("output: output is written to stdout if no output file is specified (-f /path/to/out_file.txt)\n");
    printf("\n");
}